

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O2

void __thiscall cmOrderDirectories::FindImplicitConflicts(cmOrderDirectories *this)

{
  pointer ppcVar1;
  cmake *this_00;
  ostream *poVar2;
  string *psVar3;
  uint uVar4;
  string text;
  string local_368;
  cmListFileBacktrace local_348;
  ostringstream w;
  ostringstream conflicts;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&conflicts);
  uVar4 = 0;
  while( true ) {
    ppcVar1 = (this->ImplicitDirEntries).
              super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->ImplicitDirEntries).
                      super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <=
        (ulong)uVar4) break;
    cmOrderDirectoriesConstraint::FindImplicitConflicts(ppcVar1[uVar4],&conflicts);
    uVar4 = uVar4 + 1;
  }
  std::__cxx11::stringbuf::str();
  if (text._M_string_length != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
    poVar2 = std::operator<<((ostream *)&w,"Cannot generate a safe ");
    poVar2 = std::operator<<(poVar2,(string *)&this->Purpose);
    poVar2 = std::operator<<(poVar2," for target ");
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    poVar2 = std::operator<<(poVar2," because files in some directories may conflict with ");
    poVar2 = std::operator<<(poVar2," libraries in implicit directories:\n");
    poVar2 = std::operator<<(poVar2,(string *)&text);
    std::operator<<(poVar2,"Some of these libraries may not be found correctly.");
    this_00 = this->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace(&local_348,this->Target);
    cmake::IssueMessage(this_00,WARNING,&local_368,&local_348,false);
    cmListFileBacktrace::~cmListFileBacktrace(&local_348);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
  }
  std::__cxx11::string::~string((string *)&text);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&conflicts);
  return;
}

Assistant:

void cmOrderDirectories::FindImplicitConflicts()
{
  // Check for items in implicit link directories that have conflicts
  // in the explicit directories.
  std::ostringstream conflicts;
  for(unsigned int i=0; i < this->ImplicitDirEntries.size(); ++i)
    {
    this->ImplicitDirEntries[i]->FindImplicitConflicts(conflicts);
    }

  // Skip warning if there were no conflicts.
  std::string text = conflicts.str();
  if(text.empty())
    {
    return;
    }

  // Warn about the conflicts.
  std::ostringstream w;
  w << "Cannot generate a safe " << this->Purpose
    << " for target " << this->Target->GetName()
    << " because files in some directories may conflict with "
    << " libraries in implicit directories:\n"
    << text
    << "Some of these libraries may not be found correctly.";
  this->GlobalGenerator->GetCMakeInstance()
    ->IssueMessage(cmake::WARNING, w.str(),
                   this->Target->GetBacktrace());
}